

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

mz_bool duckdb_miniz::mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint flags)

{
  ushort *puVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  int *piVar7;
  uint *puVar8;
  void *pvVar9;
  void *pvVar10;
  mz_bool mVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  ulong uVar15;
  mz_zip_internal_state *pmVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  uint uVar20;
  size_t sVar21;
  mz_zip_error mVar22;
  mz_zip_internal_state *pmVar23;
  ulong uVar24;
  byte bVar25;
  int *piVar26;
  mz_uint32 t;
  short *psVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  mz_uint32 mVar32;
  mz_uint64 mVar33;
  mz_uint64 mVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  mz_zip_internal_state *pState;
  mz_uint32 zip64_end_of_central_dir_header_u32 [14];
  mz_uint32 zip64_end_of_central_dir_locator_u32 [5];
  mz_uint32 buf_u32 [1024];
  
  uVar24 = pZip->m_archive_size;
  mVar22 = MZ_ZIP_NOT_AN_ARCHIVE;
  if (0x15 < uVar24) {
    mVar34 = 0;
    if (0x1000 < (long)uVar24) {
      mVar34 = uVar24 - 0x1000;
    }
    do {
      sVar21 = uVar24 - mVar34;
      if (0xfff < sVar21) {
        sVar21 = 0x1000;
      }
      sVar14 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar34,buf_u32,sVar21);
      if (sVar14 != sVar21) break;
      for (uVar20 = (int)sVar21 - 4; -1 < (int)uVar20; uVar20 = uVar20 - 1) {
        if ((*(int *)((long)buf_u32 + (ulong)uVar20) == 0x6054b50) &&
           (mVar33 = uVar20 + mVar34, 0x15 < pZip->m_archive_size - mVar33)) {
          sVar21 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar33,buf_u32,0x16);
          mVar22 = MZ_ZIP_FILE_READ_FAILED;
          if (sVar21 != 0x16) goto LAB_01ee2b5f;
          if (buf_u32[0] != 0x6054b50) {
            mVar22 = MZ_ZIP_NOT_AN_ARCHIVE;
            goto LAB_01ee2b5f;
          }
          if (((0x4b < (long)mVar33) &&
              (sVar21 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar33 - 0x14,
                                         zip64_end_of_central_dir_locator_u32,0x14), sVar21 == 0x14)
              ) && (zip64_end_of_central_dir_locator_u32[0] == 0x7064b50)) {
            mVar22 = MZ_ZIP_NOT_AN_ARCHIVE;
            if (pZip->m_archive_size - 0x38 < (ulong)zip64_end_of_central_dir_locator_u32._8_8_)
            goto LAB_01ee2b5f;
            sVar21 = (*pZip->m_pRead)(pZip->m_pIO_opaque,zip64_end_of_central_dir_locator_u32._8_8_,
                                      zip64_end_of_central_dir_header_u32,0x38);
            if ((sVar21 == 0x38) && (zip64_end_of_central_dir_header_u32[0] == 0x6064b50)) {
              pZip->m_pState->m_zip64 = 1;
            }
          }
          pZip->m_total_files = (uint)buf_u32[2]._2_2_;
          pmVar23 = pZip->m_pState;
          if (pmVar23->m_zip64 == 0) {
            zip64_end_of_central_dir_header_u32[6] = (mz_uint32)(ushort)buf_u32[2];
            zip64_end_of_central_dir_header_u32[5] = (mz_uint32)buf_u32[1]._2_2_;
            uVar24 = (ulong)buf_u32[4];
            mVar32 = buf_u32[3];
            zip64_end_of_central_dir_header_u32[8] = (uint)buf_u32[2]._2_2_;
            uVar20 = (uint)(ushort)buf_u32[1];
LAB_01ee2ba1:
            if ((zip64_end_of_central_dir_header_u32[8] == zip64_end_of_central_dir_header_u32[6])
               && ((uVar20 == 0 && zip64_end_of_central_dir_header_u32[5] == 0 ||
                   (zip64_end_of_central_dir_header_u32[5] == 1 && uVar20 == 1)))) {
              if ((mVar32 < zip64_end_of_central_dir_header_u32[8] * 0x2e) ||
                 (uVar15 = (ulong)mVar32, pZip->m_archive_size < uVar15 + uVar24))
              goto LAB_01ee2b53;
              pZip->m_central_directory_file_ofs = uVar24;
              if (zip64_end_of_central_dir_header_u32[8] == 0) {
                return 1;
              }
              pmVar16 = pmVar23;
              if ((pmVar23->m_central_dir).m_capacity < uVar15) {
                mVar11 = mz_zip_array_ensure_capacity(pZip,&pmVar23->m_central_dir,uVar15,0);
                if (mVar11 != 0) {
                  pmVar16 = pZip->m_pState;
                  zip64_end_of_central_dir_header_u32[8] = pZip->m_total_files;
                  goto LAB_01ee2c21;
                }
LAB_01ee2e92:
                mVar22 = MZ_ZIP_ALLOC_FAILED;
                goto LAB_01ee2b5f;
              }
LAB_01ee2c21:
              (pmVar23->m_central_dir).m_size = uVar15;
              uVar18 = (ulong)zip64_end_of_central_dir_header_u32[8];
              pmVar23 = pmVar16;
              if ((pmVar16->m_central_dir_offsets).m_capacity < uVar18) {
                mVar11 = mz_zip_array_ensure_capacity(pZip,&pmVar16->m_central_dir_offsets,uVar18,0)
                ;
                if (mVar11 == 0) goto LAB_01ee2e92;
                pmVar23 = pZip->m_pState;
              }
              (pmVar16->m_central_dir_offsets).m_size = uVar18;
              pmVar16 = pmVar23;
              if ((flags >> 0xb & 1) == 0) {
                uVar18 = (ulong)pZip->m_total_files;
                if ((pmVar23->m_sorted_central_dir_offsets).m_capacity < uVar18) {
                  mVar11 = mz_zip_array_ensure_capacity
                                     (pZip,&pmVar23->m_sorted_central_dir_offsets,uVar18,0);
                  mVar22 = MZ_ZIP_ALLOC_FAILED;
                  if (mVar11 == 0) goto LAB_01ee2b5f;
                  pmVar16 = pZip->m_pState;
                }
                (pmVar23->m_sorted_central_dir_offsets).m_size = uVar18;
              }
              sVar21 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar24,(pmVar16->m_central_dir).m_p,
                                        uVar15);
              mVar22 = MZ_ZIP_FILE_READ_FAILED;
              if (sVar21 != uVar15) goto LAB_01ee2b5f;
              pmVar23 = pZip->m_pState;
              piVar7 = (int *)(pmVar23->m_central_dir).m_p;
              uVar24 = 0;
              piVar26 = piVar7;
              goto LAB_01ee2ce1;
            }
          }
          else {
            if ((ulong)zip64_end_of_central_dir_header_u32._4_8_ < 0x2c) {
LAB_01ee2b53:
              mVar22 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
              goto LAB_01ee2b5f;
            }
            if (zip64_end_of_central_dir_locator_u32[4] == 1) {
              mVar22 = MZ_ZIP_TOO_MANY_FILES;
              if ((zip64_end_of_central_dir_header_u32[9] == 0) &&
                 (pZip->m_total_files = zip64_end_of_central_dir_header_u32[8],
                 zip64_end_of_central_dir_header_u32[7] == 0)) {
                uVar24 = zip64_end_of_central_dir_header_u32._48_8_;
                mVar32 = zip64_end_of_central_dir_header_u32[10];
                uVar20 = zip64_end_of_central_dir_header_u32[4];
                if (zip64_end_of_central_dir_header_u32[0xb] == 0) goto LAB_01ee2ba1;
                mVar22 = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
              }
              goto LAB_01ee2b5f;
            }
          }
          mVar22 = MZ_ZIP_UNSUPPORTED_MULTIDISK;
          goto LAB_01ee2b5f;
        }
      }
      if (mVar34 == 0) break;
      uVar24 = pZip->m_archive_size;
      uVar15 = uVar24 - mVar34;
      mVar34 = mVar34 - 0xffd;
    } while (uVar15 < 0x10015);
    mVar22 = MZ_ZIP_FAILED_FINDING_CENTRAL_DIR;
  }
LAB_01ee2b5f:
  pZip->m_last_error = mVar22;
  return 0;
LAB_01ee2ce1:
  uVar13 = pZip->m_total_files;
  uVar15 = (ulong)uVar13;
  if (uVar15 <= uVar24) goto LAB_01ee2ea7;
  if ((mVar32 < 0x2e) || (*piVar26 != 0x2014b50)) {
LAB_01ee2e99:
    mVar22 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    goto LAB_01ee2b5f;
  }
  *(int *)((long)(pmVar23->m_central_dir_offsets).m_p + uVar24 * 4) = (int)piVar26 - (int)piVar7;
  if ((flags >> 0xb & 1) == 0) {
    *(int *)((long)(pmVar23->m_sorted_central_dir_offsets).m_p + uVar24 * 4) = (int)uVar24;
  }
  uVar13 = piVar26[5];
  uVar15 = (ulong)uVar13;
  uVar6 = piVar26[6];
  uVar18 = (ulong)uVar6;
  if ((pmVar23->m_zip64_has_extended_info_fields == 0) &&
     (uVar12 = (uint)*(ushort *)((long)piVar26 + 0x1e), *(ushort *)((long)piVar26 + 0x1e) != 0)) {
    uVar17 = uVar18;
    if (uVar18 < uVar15) {
      uVar17 = uVar15;
    }
    uVar28 = (uint)uVar17;
    if (uVar17 <= *(uint *)((long)piVar26 + 0x2a)) {
      uVar28 = *(uint *)((long)piVar26 + 0x2a);
    }
    if (uVar28 == 0xffffffff) {
      psVar27 = (short *)((long)piVar26 + (ulong)*(ushort *)(piVar26 + 7) + 0x2e);
      do {
        if (uVar12 < 4) goto LAB_01ee2e99;
        puVar1 = (ushort *)(psVar27 + 1);
        uVar17 = (ulong)*puVar1 + 4;
        if (uVar12 < uVar17) goto LAB_01ee2e99;
        if (*psVar27 == 1) {
          pmVar23->m_zip64 = 1;
          pmVar23->m_zip64_has_extended_info_fields = 1;
          break;
        }
        psVar27 = (short *)((long)psVar27 + uVar17);
        uVar12 = (uVar12 - *puVar1) - 4;
      } while (uVar12 != 0);
    }
  }
  if (((uVar13 != 0xffffffff) && (uVar6 != 0xffffffff)) &&
     (((*(int *)((long)piVar26 + 10) == 0 && (uVar6 != uVar13)) || ((uVar18 != 0 && (uVar15 == 0))))
     )) goto LAB_01ee2e99;
  uVar4 = *(ushort *)((long)piVar26 + 0x22);
  if ((uVar4 == 0xffff) || (uVar4 != uVar20 && uVar4 != 1)) {
    mVar22 = MZ_ZIP_UNSUPPORTED_MULTIDISK;
    goto LAB_01ee2b5f;
  }
  if ((uVar13 != 0xffffffff) &&
     (pZip->m_archive_size < *(uint *)((long)piVar26 + 0x2a) + uVar15 + 0x1e)) goto LAB_01ee2e99;
  mVar22 = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
  if ((*(byte *)((long)piVar26 + 9) & 0x20) != 0) goto LAB_01ee2b5f;
  uVar13 = (uint)*(ushort *)(piVar26 + 8) +
           (uint)*(ushort *)((long)piVar26 + 0x1e) + (uint)*(ushort *)(piVar26 + 7) + 0x2e;
  bVar37 = mVar32 < uVar13;
  mVar32 = mVar32 - uVar13;
  if (bVar37) goto LAB_01ee2e99;
  piVar26 = (int *)((long)piVar26 + (ulong)uVar13);
  uVar24 = uVar24 + 1;
  goto LAB_01ee2ce1;
LAB_01ee2ea7:
  if (((flags >> 0xb & 1) == 0) && (1 < uVar13)) {
    puVar8 = (uint *)(pmVar23->m_sorted_central_dir_offsets).m_p;
    uVar24 = (ulong)(uVar13 - 2 >> 1);
    uVar18 = uVar24;
LAB_01ee2ee8:
    do {
      uVar17 = uVar24 * 2 + 1;
      if (uVar17 < uVar15) {
        pvVar9 = (pmVar23->m_central_dir).m_p;
        pvVar10 = (pmVar23->m_central_dir_offsets).m_p;
        if (uVar24 * 2 + 2 < uVar15) {
          uVar36 = (ulong)*(uint *)((long)pvVar10 + (ulong)puVar8[uVar17] * 4);
          uVar29 = (ulong)*(uint *)((long)pvVar10 + (ulong)puVar8[uVar24 * 2 + 2] * 4);
          uVar4 = *(ushort *)((long)pvVar9 + uVar36 + 0x1c);
          uVar5 = *(ushort *)((long)pvVar9 + uVar29 + 0x1c);
          uVar20 = (uint)uVar5;
          if ((uint)uVar4 < (uint)uVar5) {
            uVar20 = (uint)uVar4;
          }
          bVar19 = 0;
          for (uVar35 = 0; pbVar2 = (byte *)((long)pvVar9 + uVar35 + uVar36 + 0x2e), bVar25 = bVar19
              , pbVar2 < (byte *)((long)pvVar9 + uVar20 + uVar36 + 0x2e); uVar35 = uVar35 + 1) {
            bVar25 = *pbVar2;
            bVar19 = bVar25 + 0x20;
            if (0x19 < (byte)(bVar25 + 0xbf)) {
              bVar19 = bVar25;
            }
            bVar3 = *(byte *)((long)pvVar9 + uVar35 + uVar29 + 0x2e);
            bVar25 = bVar3 + 0x20;
            if (0x19 < (byte)(bVar3 + 0xbf)) {
              bVar25 = bVar3;
            }
            if (bVar19 != bVar25) break;
          }
          bVar37 = bVar19 < bVar25;
          if (uVar20 == uVar35) {
            bVar37 = uVar4 < uVar5;
          }
          uVar29 = (ulong)bVar37;
        }
        else {
          uVar29 = 0;
        }
        uVar29 = uVar29 + uVar17;
        uVar20 = puVar8[uVar24];
        uVar17 = (ulong)*(uint *)((long)pvVar10 + (ulong)uVar20 * 4);
        uVar36 = (ulong)*(uint *)((long)pvVar10 + (ulong)puVar8[uVar29] * 4);
        uVar4 = *(ushort *)((long)pvVar9 + uVar17 + 0x1c);
        uVar5 = *(ushort *)((long)pvVar9 + uVar36 + 0x1c);
        uVar13 = (uint)uVar5;
        if ((uint)uVar4 < (uint)uVar5) {
          uVar13 = (uint)uVar4;
        }
        bVar19 = 0;
        for (uVar35 = 0; pbVar2 = (byte *)((long)pvVar9 + uVar35 + uVar17 + 0x2e), bVar25 = bVar19,
            pbVar2 < (byte *)((long)pvVar9 + uVar13 + uVar17 + 0x2e); uVar35 = uVar35 + 1) {
          bVar19 = *pbVar2;
          bVar25 = bVar19 + 0x20;
          if (0x19 < (byte)(bVar19 + 0xbf)) {
            bVar25 = bVar19;
          }
          bVar3 = *(byte *)((long)pvVar9 + uVar35 + uVar36 + 0x2e);
          bVar19 = bVar3 + 0x20;
          if (0x19 < (byte)(bVar3 + 0xbf)) {
            bVar19 = bVar3;
          }
          if (bVar25 != bVar19) break;
          bVar19 = bVar25;
        }
        bVar37 = bVar19 <= bVar25;
        if (uVar13 == uVar35) {
          bVar37 = uVar5 <= uVar4;
        }
        if (!bVar37) {
          puVar8[uVar24] = puVar8[uVar29];
          puVar8[uVar29] = uVar20;
          uVar24 = uVar29;
          goto LAB_01ee2ee8;
        }
      }
      bVar37 = uVar18 != 0;
      uVar24 = uVar18 - 1;
      uVar18 = uVar24;
    } while (bVar37);
LAB_01ee325d:
    uVar24 = uVar15 - 1;
    if (uVar24 != 0) {
      uVar20 = puVar8[uVar15 - 1];
      puVar8[uVar15 - 1] = *puVar8;
      *puVar8 = uVar20;
      lVar30 = 0;
      while( true ) {
        uVar18 = lVar30 * 2 + 1;
        uVar15 = uVar24;
        if (uVar24 <= uVar18) break;
        pvVar9 = (pmVar23->m_central_dir).m_p;
        pvVar10 = (pmVar23->m_central_dir_offsets).m_p;
        if (lVar30 * 2 + 2U < uVar24) {
          uVar29 = (ulong)*(uint *)((long)pvVar10 + (ulong)puVar8[uVar18] * 4);
          uVar17 = (ulong)*(uint *)((long)pvVar10 + (ulong)puVar8[lVar30 * 2 + 2] * 4);
          uVar4 = *(ushort *)((long)pvVar9 + uVar29 + 0x1c);
          uVar5 = *(ushort *)((long)pvVar9 + uVar17 + 0x1c);
          uVar13 = (uint)uVar5;
          if ((uint)uVar4 < (uint)uVar5) {
            uVar13 = (uint)uVar4;
          }
          bVar19 = 0;
          for (uVar36 = 0; pbVar2 = (byte *)((long)pvVar9 + uVar36 + uVar29 + 0x2e), bVar25 = bVar19
              , pbVar2 < (byte *)((long)pvVar9 + uVar13 + uVar29 + 0x2e); uVar36 = uVar36 + 1) {
            bVar25 = *pbVar2;
            bVar19 = bVar25 + 0x20;
            if (0x19 < (byte)(bVar25 + 0xbf)) {
              bVar19 = bVar25;
            }
            bVar3 = *(byte *)((long)pvVar9 + uVar36 + uVar17 + 0x2e);
            bVar25 = bVar3 + 0x20;
            if (0x19 < (byte)(bVar3 + 0xbf)) {
              bVar25 = bVar3;
            }
            if (bVar19 != bVar25) break;
          }
          bVar37 = bVar19 < bVar25;
          if (uVar13 == uVar36) {
            bVar37 = uVar4 < uVar5;
          }
          uVar17 = (ulong)bVar37;
        }
        else {
          uVar17 = 0;
        }
        lVar31 = uVar17 + uVar18;
        uVar18 = (ulong)*(uint *)((long)pvVar10 + (ulong)uVar20 * 4);
        uVar17 = (ulong)*(uint *)((long)pvVar10 + (ulong)puVar8[lVar31] * 4);
        uVar4 = *(ushort *)((long)pvVar9 + uVar18 + 0x1c);
        uVar5 = *(ushort *)((long)pvVar9 + uVar17 + 0x1c);
        uVar13 = (uint)uVar5;
        if ((uint)uVar4 < (uint)uVar5) {
          uVar13 = (uint)uVar4;
        }
        bVar19 = 0;
        for (uVar29 = 0; pbVar2 = (byte *)((long)pvVar9 + uVar29 + uVar18 + 0x2e), bVar25 = bVar19,
            pbVar2 < (byte *)((long)pvVar9 + uVar13 + uVar18 + 0x2e); uVar29 = uVar29 + 1) {
          bVar19 = *pbVar2;
          bVar25 = bVar19 + 0x20;
          if (0x19 < (byte)(bVar19 + 0xbf)) {
            bVar25 = bVar19;
          }
          bVar3 = *(byte *)((long)pvVar9 + uVar29 + uVar17 + 0x2e);
          bVar19 = bVar3 + 0x20;
          if (0x19 < (byte)(bVar3 + 0xbf)) {
            bVar19 = bVar3;
          }
          if (bVar25 != bVar19) break;
          bVar19 = bVar25;
        }
        bVar37 = bVar19 <= bVar25;
        if (uVar13 == uVar29) {
          bVar37 = uVar5 <= uVar4;
        }
        if (bVar37) break;
        puVar8[lVar30] = puVar8[lVar31];
        puVar8[lVar31] = uVar20;
        lVar30 = lVar31;
      }
      goto LAB_01ee325d;
    }
  }
  return 1;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip, mz_uint flags)
{
    mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0, cdir_disk_index = 0;
    mz_uint64 cdir_ofs = 0;
    mz_int64 cur_file_ofs = 0;
    const mz_uint8 *p;

    mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
    mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
    mz_bool sort_central_dir = ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
    mz_uint32 zip64_end_of_central_dir_locator_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

    mz_uint32 zip64_end_of_central_dir_header_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_end_of_central_dir = (mz_uint8 *)zip64_end_of_central_dir_header_u32;

    mz_uint64 zip64_end_of_central_dir_ofs = 0;

    /* Basic sanity checks - reject files which are too small, and check the first 4 bytes of the file to make sure a local header is there. */
    if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (!mz_zip_reader_locate_header_sig(pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
        return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

    /* Read and verify the end of central directory record. */
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE, pZip64_locator, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
        {
            if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG)
            {
                zip64_end_of_central_dir_ofs = MZ_READ_LE64(pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);
                if (zip64_end_of_central_dir_ofs > (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
                    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

                if (pZip->m_pRead(pZip->m_pIO_opaque, zip64_end_of_central_dir_ofs, pZip64_end_of_central_dir, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
                {
                    if (MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG)
                    {
                        pZip->m_pState->m_zip64 = MZ_TRUE;
                    }
                }
            }
        }
    }

    pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    cdir_entries_on_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
    cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
    cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
    cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

    if (pZip->m_pState->m_zip64)
    {
        mz_uint32 zip64_total_num_of_disks = MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
        mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
        mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
        mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
        mz_uint64 zip64_size_of_central_directory = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

        if (zip64_size_of_end_of_central_dir_record < (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

        if (zip64_total_num_of_disks != 1U)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

        /* Check for miniz's practical limits */
        if (zip64_cdir_total_entries > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

        if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        cdir_entries_on_this_disk = (mz_uint32)zip64_cdir_total_entries_on_this_disk;

        /* Check for miniz's current practical limits (sorry, this should be enough for millions of files) */
        if (zip64_size_of_central_directory > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

        cdir_size = (mz_uint32)zip64_size_of_central_directory;

        num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

        cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

        cdir_ofs = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
    }

    if (pZip->m_total_files != cdir_entries_on_this_disk)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (((num_this_disk | cdir_disk_index) != 0) && ((num_this_disk != 1) || (cdir_disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (cdir_size < pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    pZip->m_central_directory_file_ofs = cdir_ofs;

    if (pZip->m_total_files)
    {
        mz_uint i, n;
        /* Read the entire central directory into a heap block, and allocate another heap block to hold the unsorted central dir file record offsets, and possibly another to hold the sorted indices. */
        if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size, MZ_FALSE)) ||
            (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets, pZip->m_total_files, MZ_FALSE)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (sort_central_dir)
        {
            if (!mz_zip_array_resize(pZip, &pZip->m_pState->m_sorted_central_dir_offsets, pZip->m_total_files, MZ_FALSE))
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs, pZip->m_pState->m_central_dir.m_p, cdir_size) != cdir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

        /* Now create an index into the central directory file records, do some basic sanity checking on each record */
        p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
        for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i)
        {
            mz_uint total_header_size, disk_index, bit_flags, filename_size, ext_data_size;
            mz_uint64 comp_size, decomp_size, local_header_ofs;

            if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) || (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, i) = (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

            if (sort_central_dir)
                MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets, mz_uint32, i) = i;

            comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
            decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
            local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
            filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
            ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

            if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
                (ext_data_size) &&
                (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) == MZ_UINT32_MAX))
            {
                /* Attempt to find zip64 extended information field in the entry's extra data */
                mz_uint32 extra_size_remaining = ext_data_size;

                if (extra_size_remaining)
                {
                    const mz_uint8 *pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;

                    do
                    {
                        mz_uint32 field_id;
                        mz_uint32 field_data_size;

                        if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        field_id = MZ_READ_LE16(pExtra_data);
                        field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

                        if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
                        {
                            /* Ok, the archive didn't have any zip64 headers but it uses a zip64 extended information field so mark it as zip64 anyway (this can occur with infozip's zip util when it reads compresses files from stdin). */
                            pZip->m_pState->m_zip64 = MZ_TRUE;
                            pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
                            break;
                        }

                        pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                        extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
                    } while (extra_size_remaining);
                }
            }

            /* I've seen archives that aren't marked as zip64 that uses zip64 ext data, argh */
            if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX))
            {
                if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) && (decomp_size != comp_size)) || (decomp_size && !comp_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
            if ((disk_index == MZ_UINT16_MAX) || ((disk_index != num_this_disk) && (disk_index != 1)))
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

            if (comp_size != MZ_UINT32_MAX)
            {
                if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
            if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

            if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) > n)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            n -= total_header_size;
            p += total_header_size;
        }
    }

    if (sort_central_dir)
        mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

    return MZ_TRUE;
}